

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O1

vec3f * barycentric(vec3f *__return_storage_ptr__,vec2f A,vec2f B,vec2f C,vec2f P)

{
  long lVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  vec3f s [2];
  
  s[1].y = 0.0;
  s[1].z = 0.0;
  s[0].z = 0.0;
  s[1].x = 0.0;
  s[0].x = 0.0;
  s[0].y = 0.0;
  lVar1 = 0x18;
  do {
    bVar2 = lVar1 != 0;
    dVar5 = A.x;
    dVar3 = C.x;
    if (bVar2) {
      dVar5 = A.y;
      dVar3 = C.y;
    }
    *(double *)((long)&s[0].x + lVar1) = dVar3 - dVar5;
    dVar3 = B.x;
    if (bVar2) {
      dVar3 = B.y;
    }
    *(double *)((long)&s[0].y + lVar1) = dVar3 - dVar5;
    dVar3 = P.x;
    if (bVar2) {
      dVar3 = P.y;
    }
    *(double *)((long)&s[0].z + lVar1) = dVar5 - dVar3;
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  dVar5 = s[0].x * s[1].y - s[1].x * s[0].y;
  if ((double)(_DAT_00108360 & (ulong)dVar5) <= _DAT_00108330) {
    dVar3 = 1.0;
    dVar6 = -1.0;
    dVar4 = 1.0;
  }
  else {
    dVar3 = s[1].x * s[0].z - s[0].x * s[1].z;
    dVar4 = s[0].y * s[1].z - s[1].y * s[0].z;
    dVar6 = 1.0 - (dVar4 + dVar3) / dVar5;
    dVar3 = dVar3 / dVar5;
    dVar4 = dVar4 / dVar5;
  }
  __return_storage_ptr__->x = dVar6;
  __return_storage_ptr__->y = dVar3;
  __return_storage_ptr__->z = dVar4;
  return __return_storage_ptr__;
}

Assistant:

vec3f barycentric(vec2f A, vec2f B, vec2f C, vec2f P)
{
    vec3f s[2];
    for (int i = 2; i--;) {
        s[i][0] = C[i] - A[i];
        s[i][1] = B[i] - A[i];
        s[i][2] = A[i] - P[i];
    }
    vec3f u = cross(s[0], s[1]);
    if (std::abs(u[2]) > 1e-2)  // dont forget that u[2] is integer. If it is zero then triangle
                                // ABC is degenerate
        return vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
    return vec3f(-1, 1, 1);  // in this case generate negative coordinates, it will be thrown
                             // away by the rasterizer
}